

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallPtrSet.cpp
# Opt level: O2

void __thiscall
llvm::SmallPtrSetImplBase::SmallPtrSetImplBase
          (SmallPtrSetImplBase *this,void **SmallStorage,SmallPtrSetImplBase *that)

{
  this->SmallArray = SmallStorage;
  if (that->CurArray != that->SmallArray) {
    SmallStorage = (void **)safe_malloc((ulong)that->CurArraySize << 3);
  }
  this->CurArray = SmallStorage;
  CopyHelper(this,that);
  return;
}

Assistant:

SmallPtrSetImplBase::SmallPtrSetImplBase(const void **SmallStorage,
                                         const SmallPtrSetImplBase &that) {
  SmallArray = SmallStorage;

  // If we're becoming small, prepare to insert into our stack space
  if (that.isSmall()) {
    CurArray = SmallArray;
  // Otherwise, allocate new heap space (unless we were the same size)
  } else {
    CurArray = (const void**)safe_malloc(sizeof(void*) * that.CurArraySize);
  }

  // Copy over the that array.
  CopyHelper(that);
}